

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDsd.c
# Opt level: O3

void If_DsdManPrintDecs(FILE *pFile,If_DsdMan_t *p)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Vec_Mem_t *pVVar4;
  Vec_Ptr_t *pVVar5;
  void **ppvVar6;
  word **ppwVar7;
  void *pvVar8;
  bool bVar9;
  double dVar10;
  int iVar11;
  byte bVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  ulong *puVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong *puVar27;
  ulong uVar28;
  ulong *puVar29;
  ulong uVar30;
  int pDecMax [15];
  int pCountsSSizes [15];
  int pCountsAll [15];
  int pCounts [15] [18];
  int *local_568;
  uint local_528 [16];
  int local_4e8 [16];
  uint local_4a8 [16];
  int local_468 [17];
  int aiStack_424 [253];
  
  local_528[0xc] = 0;
  local_528[0xd] = 0;
  local_528[0xe] = 0;
  local_528[8] = 0;
  local_528[9] = 0;
  local_528[10] = 0;
  local_528[0xb] = 0;
  local_528[4] = 0;
  local_528[5] = 0;
  local_528[6] = 0;
  local_528[7] = 0;
  local_528[0] = 0;
  local_528[1] = 0;
  local_528[2] = 0;
  local_528[3] = 0;
  local_4a8[0xc] = 0;
  local_4a8[0xd] = 0;
  local_4a8[0xe] = 0;
  local_4a8[8] = 0;
  local_4a8[9] = 0;
  local_4a8[10] = 0;
  local_4a8[0xb] = 0;
  local_4a8[4] = 0;
  local_4a8[5] = 0;
  local_4a8[6] = 0;
  local_4a8[7] = 0;
  local_4a8[0] = 0;
  local_4a8[1] = 0;
  local_4a8[2] = 0;
  local_4a8[3] = 0;
  local_4e8[0xc] = 0;
  local_4e8[0xd] = 0;
  local_4e8[0xe] = 0;
  local_4e8[8] = 0;
  local_4e8[9] = 0;
  local_4e8[10] = 0;
  local_4e8[0xb] = 0;
  local_4e8[4] = 0;
  local_4e8[5] = 0;
  local_4e8[6] = 0;
  local_4e8[7] = 0;
  local_4e8[0] = 0;
  local_4e8[1] = 0;
  local_4e8[2] = 0;
  local_4e8[3] = 0;
  local_568 = local_468;
  memset(local_568,0,0x438);
  uVar21 = p->nVars;
  uVar23 = (ulong)uVar21;
  if (2 < (int)uVar21) {
    iVar11 = uVar21 - 6;
    uVar15 = 1 << ((byte)iVar11 & 0x1f);
    uVar25 = 1;
    if (1 < (int)uVar15) {
      uVar25 = (ulong)uVar15;
    }
    lVar18 = 3;
    do {
      pVVar4 = p->vTtMem[lVar18];
      pVVar5 = p->vTtDecs[lVar18];
      uVar1 = pVVar4->nEntries;
      uVar13 = (ulong)uVar1;
      if (uVar1 != pVVar5->nSize) {
        __assert_fail("Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/if/ifDsd.c"
                      ,0x215,"void If_DsdManPrintDecs(FILE *, If_DsdMan_t *)");
      }
      if (0 < (int)uVar1) {
        ppvVar6 = pVVar5->pArray;
        ppwVar7 = pVVar4->ppPages;
        iVar2 = pVVar4->nEntrySize;
        iVar3 = pVVar4->LogPageSze;
        uVar17 = pVVar4->PageMask;
        uVar26 = 0;
        do {
          if (uVar26 == uVar13) goto LAB_00420d81;
          puVar27 = ppwVar7[(uint)uVar26 >> ((byte)iVar3 & 0x1f)] +
                    (int)((uVar17 & (uint)uVar26) * iVar2);
          uVar24 = 0;
          iVar19 = 0;
          do {
            if (uVar21 < 7) {
              if ((s_Truths6Neg[uVar24] &
                  (*puVar27 >> ((byte)(1 << ((byte)uVar24 & 0x1f)) & 0x3f) ^ *puVar27)) != 0) {
LAB_004208a1:
                iVar19 = iVar19 + 1;
              }
            }
            else if (uVar24 < 6) {
              if (iVar11 != 0x1f) {
                uVar28 = 0;
                do {
                  if (((puVar27[uVar28] >> ((byte)(1 << ((byte)uVar24 & 0x1f)) & 0x3f) ^
                       puVar27[uVar28]) & s_Truths6Neg[uVar24]) != 0) goto LAB_004208a1;
                  uVar28 = uVar28 + 1;
                } while (uVar25 != uVar28);
              }
            }
            else if (iVar11 != 0x1f) {
              bVar12 = (byte)(uVar24 - 6);
              uVar16 = 1 << (bVar12 & 0x1f);
              iVar20 = 2 << (bVar12 & 0x1f);
              uVar28 = 1;
              if (1 < (int)uVar16) {
                uVar28 = (ulong)uVar16;
              }
              puVar29 = puVar27 + (int)uVar16;
              puVar22 = puVar27;
              do {
                if (uVar24 - 6 != 0x1f) {
                  uVar30 = 0;
                  do {
                    if (puVar22[uVar30] != puVar29[uVar30]) goto LAB_004208a1;
                    uVar30 = uVar30 + 1;
                  } while (uVar28 != uVar30);
                }
                puVar22 = puVar22 + iVar20;
                puVar29 = puVar29 + iVar20;
              } while (puVar22 < puVar27 + (int)uVar15);
            }
            uVar24 = uVar24 + 1;
          } while (uVar24 != uVar23);
          uVar16 = *(uint *)((long)ppvVar6[uVar26] + 4);
          if ((int)uVar16 < (int)local_528[iVar19]) {
            uVar16 = local_528[iVar19];
          }
          local_528[iVar19] = uVar16;
          uVar26 = uVar26 + 1;
        } while (uVar26 != uVar13);
        if (0 < (int)uVar1) {
          ppvVar6 = pVVar5->pArray;
          ppwVar7 = pVVar4->ppPages;
          iVar2 = pVVar4->nEntrySize;
          iVar3 = pVVar4->LogPageSze;
          uVar1 = pVVar4->PageMask;
          uVar26 = 0;
          do {
            if (uVar26 == uVar13) {
LAB_00420d81:
              __assert_fail("i >= 0 && i < p->nEntries",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                            ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
            }
            puVar27 = ppwVar7[(uint)uVar26 >> ((byte)iVar3 & 0x1f)] +
                      (int)((uVar1 & (uint)uVar26) * iVar2);
            pvVar8 = ppvVar6[uVar26];
            uVar24 = 0;
            iVar19 = 0;
            do {
              if (uVar21 < 7) {
                if ((s_Truths6Neg[uVar24] &
                    (*puVar27 >> ((byte)(1 << ((byte)uVar24 & 0x1f)) & 0x3f) ^ *puVar27)) != 0) {
LAB_00420a2d:
                  iVar19 = iVar19 + 1;
                }
              }
              else if (uVar24 < 6) {
                if (iVar11 != 0x1f) {
                  uVar28 = 0;
                  do {
                    if (((puVar27[uVar28] >> ((byte)(1 << ((byte)uVar24 & 0x1f)) & 0x3f) ^
                         puVar27[uVar28]) & s_Truths6Neg[uVar24]) != 0) goto LAB_00420a2d;
                    uVar28 = uVar28 + 1;
                  } while (uVar25 != uVar28);
                }
              }
              else if (iVar11 != 0x1f) {
                bVar12 = (byte)(uVar24 - 6);
                uVar17 = 1 << (bVar12 & 0x1f);
                iVar20 = 2 << (bVar12 & 0x1f);
                uVar28 = 1;
                if (1 < (int)uVar17) {
                  uVar28 = (ulong)uVar17;
                }
                puVar22 = puVar27 + (int)uVar17;
                puVar29 = puVar27;
                do {
                  if (uVar24 - 6 != 0x1f) {
                    uVar30 = 0;
                    do {
                      if (puVar29[uVar30] != puVar22[uVar30]) goto LAB_00420a2d;
                      uVar30 = uVar30 + 1;
                    } while (uVar28 != uVar30);
                  }
                  puVar29 = puVar29 + iVar20;
                  puVar22 = puVar22 + iVar20;
                } while (puVar29 < puVar27 + (int)uVar15);
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != uVar23);
            lVar14 = (long)iVar19;
            local_4a8[lVar14] = local_4a8[lVar14] + 1;
            iVar19 = *(int *)((long)pvVar8 + 4);
            local_4e8[lVar14] = local_4e8[lVar14] + iVar19;
            if (0x10 < iVar19) {
              iVar19 = 0x11;
            }
            local_468[lVar14 * 0x12 + (long)iVar19] = local_468[lVar14 * 0x12 + (long)iVar19] + 1;
            uVar26 = uVar26 + 1;
          } while (uVar26 != uVar13);
        }
      }
      lVar18 = lVar18 + 1;
    } while (lVar18 != uVar23 + 1);
  }
  fwrite(" N :  ",6,1,(FILE *)pFile);
  fwrite(" Total  ",8,1,(FILE *)pFile);
  uVar23 = 0;
  do {
    fprintf((FILE *)pFile,"%6d",uVar23);
    uVar21 = (int)uVar23 + 1;
    uVar23 = (ulong)uVar21;
  } while (uVar21 != 0x11);
  fwrite("  ",2,1,(FILE *)pFile);
  fwrite("  More",6,1,(FILE *)pFile);
  fwrite("     Ave",8,1,(FILE *)pFile);
  fwrite("     Max",8,1,(FILE *)pFile);
  fputc(10,(FILE *)pFile);
  if (-1 < p->nVars) {
    uVar23 = 0;
    do {
      fprintf((FILE *)pFile,"%2d :  ",uVar23 & 0xffffffff);
      uVar21 = local_4a8[uVar23];
      fprintf((FILE *)pFile,"%6d  ",(ulong)uVar21);
      if ((int)uVar21 < 2) {
        uVar21 = 1;
      }
      dVar10 = (double)(int)uVar21;
      lVar18 = 0;
      do {
        fprintf((FILE *)pFile,"%6.1f",SUB84(((double)local_568[lVar18] * 100.0) / dVar10,0));
        lVar18 = lVar18 + 1;
      } while (lVar18 != 0x11);
      fwrite("  ",2,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%6.1f",SUB84(((double)aiStack_424[uVar23 * 0x12] * 100.0) / dVar10,0));
      fwrite("  ",2,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%6.1f",SUB84((double)local_4e8[uVar23] / dVar10,0));
      fwrite("  ",2,1,(FILE *)pFile);
      fprintf((FILE *)pFile,"%6d",(ulong)local_528[uVar23]);
      fputc(10,(FILE *)pFile);
      local_568 = local_568 + 0x12;
      bVar9 = (long)uVar23 < (long)p->nVars;
      uVar23 = uVar23 + 1;
    } while (bVar9);
  }
  return;
}

Assistant:

void If_DsdManPrintDecs( FILE * pFile, If_DsdMan_t * p )
{
    Vec_Int_t * vDecs;
    int i, k, v, nSuppSize, nDecMax = 0;
    int pDecMax[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsAll[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCountsSSizes[IF_MAX_FUNC_LUTSIZE] = {0};
    int pCounts[IF_MAX_FUNC_LUTSIZE][DSD_ARRAY_LIMIT+2] = {{0}};
    word * pTruth;
    for ( v = 3; v <= p->nVars; v++ )
    {
        assert( Vec_MemEntryNum(p->vTtMem[v]) == Vec_PtrSize(p->vTtDecs[v]) );
        // find max number of decompositions
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pDecMax[nSuppSize] = Abc_MaxInt( pDecMax[nSuppSize], Vec_IntSize(vDecs) );
            nDecMax = Abc_MaxInt( nDecMax, Vec_IntSize(vDecs) );
        }
        // fill up
        Vec_PtrForEachEntry( Vec_Int_t *, p->vTtDecs[v], vDecs, i )
        {
            pTruth = Vec_MemReadEntry( p->vTtMem[v], i );
            nSuppSize = Abc_TtSupportSize( pTruth, p->nVars );
            pCountsAll[nSuppSize]++;
            pCountsSSizes[nSuppSize] += Vec_IntSize(vDecs);
            pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs))]++;
    //        pCounts[nSuppSize][Abc_MinInt(DSD_ARRAY_LIMIT+1,Vec_IntSize(vDecs)?1+(Vec_IntSize(vDecs)/10):0)]++;
    /*
            if ( nSuppSize == 6 && Vec_IntSize(vDecs) == pDecMax[6] )
            {
                fprintf( pFile, "0x" );
                Abc_TtPrintHex( pTruth, nSuppSize );
                Dau_DecPrintSets( vDecs, nSuppSize );
            }
    */
        }
    }
    // print header
    fprintf( pFile, " N :  " );
    fprintf( pFile, " Total  " );
    for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
        fprintf( pFile, "%6d", k );
    fprintf( pFile, "  " );
    fprintf( pFile, "  More" );
    fprintf( pFile, "     Ave" );
    fprintf( pFile, "     Max" );
    fprintf( pFile, "\n" );
    // print rows
    for ( i = 0; i <= p->nVars; i++ )
    {
        fprintf( pFile, "%2d :  ", i );
        fprintf( pFile, "%6d  ", pCountsAll[i] );
        for ( k = 0; k <= DSD_ARRAY_LIMIT; k++ )
//            fprintf( pFile, "%6d", pCounts[i][k] );
            fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
//        fprintf( pFile, "%6d", pCounts[i][k] );
        fprintf( pFile, "%6.1f", 100.0*pCounts[i][k]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6.1f", 1.0*pCountsSSizes[i]/Abc_MaxInt(1,pCountsAll[i]) );
        fprintf( pFile, "  " );
        fprintf( pFile, "%6d", pDecMax[i] );
        fprintf( pFile, "\n" );
    }
}